

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void outlet_free(_outlet *x)

{
  t_object *ptVar1;
  _outlet *local_20;
  _outlet *x2;
  t_object *y;
  _outlet *x_local;
  
  ptVar1 = x->o_owner;
  if (ptVar1->te_outlet == x) {
    ptVar1->te_outlet = x->o_next;
  }
  else {
    for (local_20 = ptVar1->te_outlet; local_20 != (_outlet *)0x0; local_20 = local_20->o_next) {
      if (local_20->o_next == x) {
        local_20->o_next = x->o_next;
        break;
      }
    }
  }
  freebytes(x,0x20);
  return;
}

Assistant:

void outlet_free(t_outlet *x)
{
    t_object *y = x->o_owner;
    t_outlet *x2;
    if (y->ob_outlet == x) y->ob_outlet = x->o_next;
    else for (x2 = y->ob_outlet; x2; x2 = x2->o_next)
        if (x2->o_next == x)
    {
        x2->o_next = x->o_next;
        break;
    }
    t_freebytes(x, sizeof(*x));
}